

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

word Abc_SuppFindOne(Vec_Wrd_t *p,int nBits)

{
  int iVar1;
  uint iVar;
  undefined8 in_RAX;
  int iVar2;
  ulong uVar3;
  undefined8 uStack_38;
  int This;
  
  uVar3 = 0;
  uStack_38 = in_RAX;
  iVar2 = -1;
  while( true ) {
    iVar = Abc_SuppGenFindBest(p,nBits,&This);
    iVar1 = This;
    if (This <= iVar2) break;
    Abc_SuppGenSelectVar(p,nBits,iVar);
    uVar3 = uVar3 | 1L << ((ulong)iVar & 0x3f);
    iVar2 = iVar1;
  }
  return uVar3;
}

Assistant:

word Abc_SuppFindOne( Vec_Wrd_t * p, int nBits )
{
    word uMask = 0;
    int Prev = -1, This, Var;
    while ( 1 )
    {
        Var = Abc_SuppGenFindBest( p, nBits, &This );
        if ( Prev >= This )
            break;
        Prev = This;
        Abc_SuppGenSelectVar( p, nBits, Var );
        uMask |= (((word)1) << Var);
    }
    return uMask;
}